

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_accept(uv_stream_t *server,uv_stream_t *client)

{
  uv_handle_type uVar1;
  void *ptr;
  int iVar2;
  uv__stream_queued_fds_t *queued_fds;
  int err;
  uv_stream_t *client_local;
  uv_stream_t *server_local;
  
  if (server->loop != client->loop) {
    __assert_fail("server->loop == client->loop",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x241,"int uv_accept(uv_stream_t *, uv_stream_t *)");
  }
  if (server->accepted_fd == -1) {
    return -0xb;
  }
  uVar1 = client->type;
  if ((uVar1 == UV_NAMED_PIPE) || (uVar1 == UV_TCP)) {
    queued_fds._4_4_ = uv__stream_open(client,server->accepted_fd,0x60);
    if (queued_fds._4_4_ != 0) {
      uv__close(server->accepted_fd);
      goto LAB_00a107f0;
    }
  }
  else {
    if (uVar1 != UV_UDP) {
      return -0x16;
    }
    queued_fds._4_4_ = uv_udp_open((uv_udp_t *)client,server->accepted_fd);
    if (queued_fds._4_4_ != 0) {
      uv__close(server->accepted_fd);
      goto LAB_00a107f0;
    }
  }
  client->flags = client->flags | 0x40000;
LAB_00a107f0:
  if (server->queued_fds == (void *)0x0) {
    server->accepted_fd = -1;
    if (queued_fds._4_4_ == 0) {
      uv__io_start(server->loop,&server->io_watcher,1);
    }
  }
  else {
    ptr = server->queued_fds;
    server->accepted_fd = *(int *)((long)ptr + 8);
    if (*(int *)((long)ptr + 4) == 0) {
      __assert_fail("queued_fds->offset > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x26c,"int uv_accept(uv_stream_t *, uv_stream_t *)");
    }
    iVar2 = *(int *)((long)ptr + 4) + -1;
    *(int *)((long)ptr + 4) = iVar2;
    if (iVar2 == 0) {
      uv__free(ptr);
      server->queued_fds = (void *)0x0;
    }
    else {
      memmove((void *)((long)ptr + 8),(void *)((long)ptr + 0xc),(ulong)*(uint *)((long)ptr + 4) << 2
             );
    }
  }
  return queued_fds._4_4_;
}

Assistant:

int uv_accept(uv_stream_t* server, uv_stream_t* client) {
  int err;

  assert(server->loop == client->loop);

  if (server->accepted_fd == -1)
    return -EAGAIN;

  switch (client->type) {
    case UV_NAMED_PIPE:
    case UV_TCP:
      err = uv__stream_open(client,
                            server->accepted_fd,
                            UV_STREAM_READABLE | UV_STREAM_WRITABLE);
      if (err) {
        /* TODO handle error */
        uv__close(server->accepted_fd);
        goto done;
      }
      break;

    case UV_UDP:
      err = uv_udp_open((uv_udp_t*) client, server->accepted_fd);
      if (err) {
        uv__close(server->accepted_fd);
        goto done;
      }
      break;

    default:
      return -EINVAL;
  }

  client->flags |= UV_HANDLE_BOUND;

done:
  /* Process queued fds */
  if (server->queued_fds != NULL) {
    uv__stream_queued_fds_t* queued_fds;

    queued_fds = server->queued_fds;

    /* Read first */
    server->accepted_fd = queued_fds->fds[0];

    /* All read, free */
    assert(queued_fds->offset > 0);
    if (--queued_fds->offset == 0) {
      uv__free(queued_fds);
      server->queued_fds = NULL;
    } else {
      /* Shift rest */
      memmove(queued_fds->fds,
              queued_fds->fds + 1,
              queued_fds->offset * sizeof(*queued_fds->fds));
    }
  } else {
    server->accepted_fd = -1;
    if (err == 0)
      uv__io_start(server->loop, &server->io_watcher, POLLIN);
  }
  return err;
}